

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GRouter.cpp
# Opt level: O2

int CGRouter::ConcurrentRouting
              (CDesign *pDesign,vector<CWire_*,_std::allocator<CWire_*>_> *pWireList,int iMode)

{
  undefined1 *pName;
  char cVar1;
  short sVar2;
  short sVar3;
  CNet *pCVar4;
  pointer ppCVar5;
  CSegment *pCVar6;
  CPoint *pCVar7;
  CPoint *pCVar8;
  CBoundary *this;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  CLayer *pCVar16;
  int *piVar17;
  undefined4 extraout_var;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pvVar18;
  _Base_ptr p_Var19;
  FILE *__stream;
  char *pcVar20;
  CWire *pCVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  CDesign *pDesign_00;
  ulong uVar25;
  double dVar26;
  iterator iVar27;
  int local_53c;
  CBoundary *pBoundary;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *local_530;
  CWire *local_528;
  int local_51c;
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  InverseVariable;
  CILPSolver ILPSolver;
  double local_4b0;
  hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
  Variable;
  set<CBoundary_*,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_> Boundary;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pSegmentList;
  char cName [512];
  
  CILPSolver::CILPSolver(&ILPSolver);
  CILPSolver::Delete(&ILPSolver);
  pName = &pDesign->field_0x234;
  pDesign_00 = (CDesign *)&ILPSolver;
  CILPSolver::Create((CILPSolver *)pDesign_00,pName);
  uVar22 = (ulong)((long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  uVar25 = 0;
  uVar15 = uVar22 & 0xffffffff;
  if ((int)uVar22 < 1) {
    uVar15 = uVar25;
  }
  local_53c = 0;
  for (; uVar15 != uVar25; uVar25 = uVar25 + 1) {
    pCVar21 = (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar25];
    if ((pCVar21 != (CWire *)0x0) && (iVar9 = FilterRouting(pDesign_00,pCVar21), iVar9 != 0)) {
      (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar25] = (CWire *)0x0;
      local_53c = local_53c + 1;
    }
  }
  InverseVariable.
  super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  InverseVariable.
  super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  InverseVariable.
  super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __gnu_cxx::
  hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
  ::hash_map(&Variable);
  Boundary._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &Boundary._M_t._M_impl.super__Rb_tree_header._M_header;
  Boundary._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  Boundary._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  Boundary._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Boundary._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       Boundary._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ::reserve(&InverseVariable,
            ((long)(pDesign->super_CBBox).m_cMaxZ - (long)(pDesign->super_CBBox).m_cMinZ) *
            ((long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2));
  pSegmentList = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0;
  std::
  vector<std::vector<CSegment*,std::allocator<CSegment*>>*,std::allocator<std::vector<CSegment*,std::allocator<CSegment*>>*>>
  ::emplace_back<std::vector<CSegment*,std::allocator<CSegment*>>*>
            ((vector<std::vector<CSegment*,std::allocator<CSegment*>>*,std::allocator<std::vector<CSegment*,std::allocator<CSegment*>>*>>
              *)&InverseVariable,&pSegmentList);
  uVar15 = (ulong)((long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  iVar9 = (int)uVar15;
  uVar22 = 0;
  if (0 < iVar9) {
    uVar22 = uVar15 & 0xffffffff;
  }
  local_4b0 = 0.0;
  if ((iMode & 8U) == 0) {
    local_4b0 = 1.0;
  }
  for (uVar15 = 0; uVar15 != uVar22; uVar15 = uVar15 + 1) {
    pCVar21 = (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar15];
    if (pCVar21 != (CWire *)0x0) {
      if (((pCVar21->super_CObject).m_iState & 1) != 0) {
        __assert_fail("!pWire->IsRouted()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                      ,0x71c,
                      "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)");
      }
      pCVar4 = (CNet *)(pCVar21->super_CObject).m_pParent;
      if (pCVar4 == (CNet *)0x0) {
        CWire::Delete(pCVar21);
        (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar15] = (CWire *)0x0;
        local_53c = local_53c + 1;
      }
      else {
        local_528 = pCVar21;
        iVar10 = CNet::IsRouted(pCVar4);
        if (iVar10 != 0) {
          __assert_fail("!pNet->IsRouted()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                        ,0x72b,
                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)")
          ;
        }
        iVar10 = CWire::IsPoint(local_528);
        if (iVar10 != 0) {
          __assert_fail("!pWire->IsPoint()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                        ,0x72c,
                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)")
          ;
        }
        CWire::Enumerate(local_528,1);
        local_51c = CWire::GetNumSegmentList(local_528);
        iVar24 = 0;
        iVar10 = 0;
        if (0 < local_51c) {
          iVar10 = local_51c;
        }
        for (; iVar24 != iVar10; iVar24 = iVar24 + 1) {
          pSegmentList = CWire::GetSegmentList(local_528,iVar24);
          pvVar18 = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0;
          while (ppCVar5 = (pSegmentList->
                           super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                           super__Vector_impl_data._M_start,
                pvVar18 < (vector<CSegment_*,_std::allocator<CSegment_*>_> *)
                          ((long)(pSegmentList->
                                 super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 >> 3)) {
            pCVar6 = ppCVar5[(long)pvVar18];
            pBoundary = (CBoundary *)0x0;
            local_530 = pvVar18;
            iVar11 = CSegment::IsHorizontal(pCVar6);
            if (iVar11 == 0) {
              iVar11 = CSegment::IsVertical(pCVar6);
              if (iVar11 == 0) {
                __assert_fail("FALSE",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x76b,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              pCVar7 = pCVar6->m_pPointE;
              pCVar8 = pCVar6->m_pPointS;
              sVar2 = pCVar8->m_iX;
              if (sVar2 != pCVar7->m_iX) {
                __assert_fail("pCurSegment->m_pPointS->X()==pCurSegment->m_pPointE->X()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x755,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              cVar1 = pCVar8->m_cZ;
              if (cVar1 != pCVar7->m_cZ) {
                __assert_fail("pCurSegment->m_pPointS->Z()==pCurSegment->m_pPointE->Z()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x756,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              iVar11 = (int)pCVar8->m_iY;
              sVar3 = pCVar7->m_iY;
              if (sVar3 < pCVar8->m_iY) {
                __assert_fail("iMinY<=iMaxY",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x75c,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              for (; iVar11 < sVar3; iVar11 = iVar11 + 1) {
                pCVar16 = CDesign::GetLayer(pDesign,(int)cVar1);
                pBoundary = CLayer::GetBoundary(pCVar16,(int)sVar2,iVar11);
                if (pBoundary == (CBoundary *)0x0) {
                  __assert_fail("pBoundary",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                ,0x761,
                                "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                               );
                }
                iVar12 = CBoundary::IsFound(pBoundary,pCVar4);
                if (iVar12 == 0) {
                  CBoundary::AddSegmentList(pBoundary,pSegmentList);
                  std::
                  _Rb_tree<CBoundary*,CBoundary*,std::_Identity<CBoundary*>,std::less<CBoundary*>,std::allocator<CBoundary*>>
                  ::_M_insert_unique<CBoundary*const&>
                            ((_Rb_tree<CBoundary*,CBoundary*,std::_Identity<CBoundary*>,std::less<CBoundary*>,std::allocator<CBoundary*>>
                              *)&Boundary,&pBoundary);
                }
              }
            }
            else {
              pCVar7 = pCVar6->m_pPointE;
              pCVar8 = pCVar6->m_pPointS;
              sVar2 = pCVar8->m_iY;
              if (sVar2 != pCVar7->m_iY) {
                __assert_fail("pCurSegment->m_pPointS->Y()==pCurSegment->m_pPointE->Y()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x73d,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              cVar1 = pCVar8->m_cZ;
              if (cVar1 != pCVar7->m_cZ) {
                __assert_fail("pCurSegment->m_pPointS->Z()==pCurSegment->m_pPointE->Z()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x73e,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              iVar11 = (int)pCVar8->m_iX;
              sVar3 = pCVar7->m_iX;
              if (sVar3 < pCVar8->m_iX) {
                __assert_fail("iMinX<=iMaxX",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                              ,0x744,
                              "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                             );
              }
              for (; iVar11 < sVar3; iVar11 = iVar11 + 1) {
                pCVar16 = CDesign::GetLayer(pDesign,(int)cVar1);
                pBoundary = CLayer::GetBoundary(pCVar16,iVar11,(int)sVar2);
                if (pBoundary == (CBoundary *)0x0) {
                  __assert_fail("pBoundary",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                                ,0x749,
                                "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                               );
                }
                iVar12 = CBoundary::IsFound(pBoundary,pCVar4);
                if (iVar12 == 0) {
                  CBoundary::AddSegmentList(pBoundary,pSegmentList);
                  std::
                  _Rb_tree<CBoundary*,CBoundary*,std::_Identity<CBoundary*>,std::less<CBoundary*>,std::allocator<CBoundary*>>
                  ::_M_insert_unique<CBoundary*const&>
                            ((_Rb_tree<CBoundary*,CBoundary*,std::_Identity<CBoundary*>,std::less<CBoundary*>,std::allocator<CBoundary*>>
                              *)&Boundary,&pBoundary);
                }
              }
            }
            pvVar18 = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)
                      ((long)&(local_530->
                              super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                              super__Vector_impl_data._M_start + 1);
          }
          if (((uint)iMode >> 0xc & 1) == 0) {
            if (((uint)iMode >> 0xd & 1) != 0) {
              iVar11 = CILPSolver::GetNumVariable(&ILPSolver);
              sprintf(cName,"X%d",(ulong)(iVar11 + 1));
            }
          }
          else {
            cName[0] = '\0';
          }
          if ((iMode & 8U) == 0) {
            if ((iMode & 0x14U) != 0) {
              iVar11 = CILPSolver::AddVariable(&ILPSolver,cName,0.0,1,0.0,1,1.0);
              pBoundary = (CBoundary *)pSegmentList;
              piVar17 = __gnu_cxx::
                        hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                        ::operator[](&Variable,(key_type *)&pBoundary);
              goto LAB_0010a31b;
            }
          }
          else {
            dVar26 = 1.0;
            if ((pDesign->field_0xc51 & 4) != 0) {
              dVar26 = CWire::GetSegmentListCost(pSegmentList);
              dVar26 = (1.0 / dVar26) / (double)iVar9 + 1.0;
            }
            iVar11 = CILPSolver::AddVariable(&ILPSolver,cName,dVar26,1,0.0,1,1.0);
            pBoundary = (CBoundary *)pSegmentList;
            piVar17 = __gnu_cxx::
                      hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                      ::operator[](&Variable,(key_type *)&pBoundary);
LAB_0010a31b:
            *piVar17 = iVar11;
          }
          std::
          vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
          ::push_back(&InverseVariable,&pSegmentList);
        }
        CILPSolver::PrepareCoeffBuffer
                  (&ILPSolver,local_51c + 1,(uint)Variable._M_ht._M_num_elements);
        if (((uint)iMode >> 0xc & 1) == 0) {
          if (((uint)iMode >> 0xd & 1) != 0) {
            iVar10 = CILPSolver::GetNumConstraint(&ILPSolver);
            sprintf(cName,"Z%d",(ulong)(iVar10 + 1));
          }
        }
        else {
          cName[0] = '\0';
        }
        if ((iMode & 0x1cU) != 0) {
          CILPSolver::AddConstraint(&ILPSolver,cName,local_51c,1,local_4b0,1,1.0);
        }
      }
    }
  }
  std::
  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
  ::resize(&InverseVariable,
           (long)InverseVariable.
                 super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)InverseVariable.
                 super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (CONCAT44(Variable._M_ht._M_num_elements._4_4_,(uint)Variable._M_ht._M_num_elements) !=
      ((long)InverseVariable.
             super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)InverseVariable.
             super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) + -1) {
    __assert_fail("Variable.size()==InverseVariable.size()-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                  ,0x7b1,"static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                 );
  }
  if ((char)((iMode & 8U) >> 3) == '\0' && (iMode & 0x14U) != 0) {
    iVar9 = CILPSolver::AddVariable(&ILPSolver,"v-D",1.0,1,0.0,0,2139062143.0);
    if ((iMode & 0x10U) != 0) {
      CILPSolver::SetCoeffIndex(&ILPSolver,1,iVar9);
      iVar10 = CDesign::GetCapacity(pDesign,0x40);
      CILPSolver::AddConstraint(&ILPSolver,"c-D",1,1,0.0,1,(double)(iVar10 + 1));
    }
  }
  else {
    iVar9 = -1;
  }
  local_528 = (CWire *)CONCAT44(local_528._4_4_,iVar9);
  for (p_Var19 = Boundary._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var19 != &Boundary._M_t._M_impl.super__Rb_tree_header;
      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19)) {
    this = *(CBoundary **)(p_Var19 + 1);
    iVar9 = CBoundary::GetNumSegmentList(this);
    local_530 = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)CONCAT44(extraout_var,iVar9);
    CILPSolver::PrepareCoeffBuffer(&ILPSolver,iVar9 + 2,0);
    iVar9 = 0;
    uVar15 = 0;
    if (0 < (int)local_530) {
      uVar15 = (ulong)local_530 & 0xffffffff;
    }
    while ((int)uVar15 != iVar9) {
      pvVar18 = CBoundary::GetSegmentList(this,iVar9);
      pSegmentList = pvVar18;
      iVar27 = __gnu_cxx::
               hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::find(&Variable._M_ht,(key_type *)&pSegmentList);
      if (iVar27._M_cur == (_Node *)0x0) {
        __assert_fail("Variable.find((ADDRESS)pSegmentList)!=Variable.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                      ,0x7d4,
                      "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)");
      }
      pSegmentList = pvVar18;
      iVar27 = __gnu_cxx::
               hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::find(&Variable._M_ht,(key_type *)&pSegmentList);
      iVar9 = iVar9 + 1;
      CILPSolver::SetCoeffIndex(&ILPSolver,iVar9,((iVar27._M_cur)->_M_val).second);
      CILPSolver::SetCoeff(&ILPSolver,iVar9,2);
    }
    if (((uint)iMode >> 0xc & 1) == 0) {
      if (((uint)iMode >> 0xd & 1) != 0) {
        uVar13 = CILPSolver::GetNumConstraint(&ILPSolver);
        sprintf(cName,"Y%d",(ulong)uVar13);
      }
    }
    else {
      cName[0] = '\0';
    }
    if ((iMode & 8U) == 0) {
      if ((iMode & 0x14U) != 0) {
        if ((int)local_528 < 1) {
          __assert_fail("iD>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                        ,0x7ef,
                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)")
          ;
        }
        iVar24 = (int)uVar15 + 1;
        CILPSolver::SetCoeffIndex(&ILPSolver,iVar24,(int)local_528);
        pCVar16 = CBoundary::GetParent(this);
        iVar9 = CLayer::GetCapacity(pCVar16,0x40);
        iVar10 = CDesign::GetCapacity(pDesign,0x40);
        CILPSolver::SetCoeff(&ILPSolver,iVar24,-(double)iVar9 / (double)iVar10);
        iVar9 = CBoundary::GetCapacity(this,0x2000);
        CILPSolver::AddConstraint(&ILPSolver,cName,(int)local_530 + 1,0,0.0,1,(double)-iVar9);
        CILPSolver::SetCoeff(&ILPSolver,iVar24,1);
      }
    }
    else {
      if ((int)local_528 != -1) {
        __assert_fail("iD==-1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                      ,0x7ea,
                      "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)");
      }
      iVar9 = CBoundary::GetCapacity(this,0x1000);
      CILPSolver::AddConstraint(&ILPSolver,cName,(int)local_530,1,0.0,1,(double)iVar9);
    }
    CBoundary::ClearSegmentList(this);
    iVar9 = CBoundary::GetNumSegmentList(this);
    if (iVar9 != 0) {
      __assert_fail("pBoundary->GetNumSegmentList()==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                    ,0x7fa,
                    "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)");
    }
  }
  uVar13 = CILPSolver::GetNumVariable(&ILPSolver);
  uVar14 = CILPSolver::GetNumConstraint(&ILPSolver);
  CObject::PrintMsg2("..#v=%d #c=%d ",(ulong)uVar13,(ulong)uVar14);
  if (((uint)iMode >> 0xc & 1) == 0) {
    if (((uint)iMode >> 0xd & 1) != 0) {
      sprintf(cName,"%s_l%d.mps",pName,(ulong)(pDesign->m_iLoop - 1));
      CILPSolver::Write(&ILPSolver,cName,1);
      sprintf((char *)&pSegmentList,
              "mosek -max %s -d MSK_IPAR_READ_MPS_FORMAT 2 -d MSK_IPAR_WRITE_SOL_CONSTRAINTS 0 -d MSK_IPAR_WRITE_BAS_CONSTRAINTS 0 -d MSK_IPAR_WRITE_BAS_HEAD 0 -d MSK_IPAR_WRITE_BAS_VARIABLES 0 -d MSK_IPAR_LOG 0"
              ,cName);
      CreateAndWait((char *)&pSegmentList);
      sprintf(cName,"%s_l%d.sol",pName,(ulong)(pDesign->m_iLoop - 1));
      __stream = fopen(cName,"rt");
      while (pcVar20 = fgets((char *)&pSegmentList,0x200,__stream), pcVar20 != (char *)0x0) {
        strtok((char *)&pSegmentList," \t\n");
        pcVar20 = strtok((char *)0x0," \t\n");
        if ((pcVar20 != (char *)0x0) && (*pcVar20 == 'X')) {
          iVar9 = atoi(pcVar20 + 1);
          strtok((char *)0x0," \t\n");
          pcVar20 = strtok((char *)0x0," \t\n");
          dVar26 = atof(pcVar20);
          if (0.5 <= dVar26) {
            pCVar6 = *(InverseVariable.
                       super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar9]->
                      super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pCVar21 = CSegment::GetParent(pCVar6);
            if (pCVar21->m_pRoutedSegmentList !=
                (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0) {
              __assert_fail("pSegment->GetParent()->m_pRoutedSegmentList==NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                            ,0x873,
                            "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                           );
            }
            pvVar18 = InverseVariable.
                      super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar9];
            pCVar21 = CSegment::GetParent(pCVar6);
            pCVar21->m_pRoutedSegmentList = pvVar18;
            pCVar21 = CSegment::GetParent(pCVar6);
            if ((pCVar21->m_pRoutedSegmentList->
                super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                super__Vector_impl_data._M_finish ==
                (pCVar21->m_pRoutedSegmentList->
                super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                super__Vector_impl_data._M_start) {
              __assert_fail("pSegment->GetParent()->m_pRoutedSegmentList->size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                            ,0x875,
                            "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)"
                           );
            }
          }
        }
      }
    }
    goto LAB_0010aa74;
  }
  if ((iMode & 8U) == 0) {
    if ((iMode & 4U) != 0) {
      iVar10 = 0x2100000;
      iVar9 = 0x2010000;
      goto LAB_0010a903;
    }
    if ((iMode & 0x10U) == 0) {
LAB_0010aa61:
      CObject::PrintMsg2("\t= discarded (maxc %d)\n",20000);
      goto LAB_0010aa74;
    }
    if ((iMode & 0x20U) == 0) {
      iVar10 = CILPSolver::GetNumConstraint(&ILPSolver);
      iVar9 = 0x2100000;
    }
    else {
      iVar10 = CILPSolver::GetNumConstraint(&ILPSolver);
      iVar9 = 0x2010000;
    }
    if (20000 < iVar10) goto LAB_0010aa61;
  }
  else {
    iVar10 = 0x1100000;
    iVar9 = 0x1010000;
LAB_0010a903:
    if ((iMode & 0x20U) == 0) {
      iVar9 = iVar10;
    }
  }
  pSegmentList = (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0;
  CILPSolver::PrepareSolutionBuffer
            (&ILPSolver,
             (int)((ulong)((long)InverseVariable.
                                 super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)InverseVariable.
                                super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3));
  iVar9 = CILPSolver::Solve(&ILPSolver,iVar9,(double *)&pSegmentList);
  if (iVar9 != 0) {
    CObject::PrintMsg2("*o=%.2f\t",pSegmentList);
    if ((iMode & 0x20U) != 0) {
      CILPSolver::RoundUp(&ILPSolver,0.5);
    }
    if ((iMode & 0x10U) != 0) {
      local_530 = pSegmentList;
      iVar9 = CDesign::GetCapacity(pDesign,0x40);
      if (iVar9 < (int)(double)local_530) {
        CObject::PrintMsg2("=give up solution\n");
        goto LAB_0010aa74;
      }
    }
    uVar15 = 0;
    if (0 < (int)(uint)Variable._M_ht._M_num_elements) {
      uVar15 = (ulong)(uint)Variable._M_ht._M_num_elements;
    }
    for (lVar23 = 1; lVar23 - uVar15 != 1; lVar23 = lVar23 + 1) {
      dVar26 = CILPSolver::GetSolution(&ILPSolver,(int)lVar23);
      if ((dVar26 != 0.0) || (NAN(dVar26))) {
        pvVar18 = InverseVariable.
                  super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar23];
        pCVar6 = *(pvVar18->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar21 = CSegment::GetParent(pCVar6);
        pCVar21->m_pRoutedSegmentList = pvVar18;
        pCVar21 = CSegment::GetParent(pCVar6);
        if ((pCVar21->m_pRoutedSegmentList->
            super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
            super__Vector_impl_data._M_finish ==
            (pCVar21->m_pRoutedSegmentList->
            super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
            super__Vector_impl_data._M_start) {
          __assert_fail("pSegment->GetParent()->m_pRoutedSegmentList->size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                        ,0x83e,
                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)")
          ;
        }
      }
    }
  }
LAB_0010aa74:
  uVar25 = (ulong)((long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  uVar22 = 0;
  uVar15 = uVar25 & 0xffffffff;
  if ((int)uVar25 < 1) {
    uVar15 = uVar22;
  }
  do {
    if (uVar15 == uVar22) {
      std::
      _Rb_tree<CBoundary_*,_CBoundary_*,_std::_Identity<CBoundary_*>,_std::less<CBoundary_*>,_std::allocator<CBoundary_*>_>
      ::~_Rb_tree(&Boundary._M_t);
      __gnu_cxx::
      hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
      ::~hashtable(&Variable._M_ht);
      std::
      _Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
      ::~_Vector_base(&InverseVariable.
                       super__Vector_base<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_*>_>
                     );
      CILPSolver::~CILPSolver(&ILPSolver);
      return local_53c;
    }
    pCVar21 = (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar22];
    if (pCVar21 != (CWire *)0x0) {
      pCVar4 = (CNet *)(pCVar21->super_CObject).m_pParent;
      if (pCVar4 == (CNet *)0x0) {
        CWire::Delete(pCVar21);
        (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar22] = (CWire *)0x0;
      }
      else {
        pvVar18 = pCVar21->m_pRoutedSegmentList;
        if (pvVar18 == (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0) {
          CWire::ClearSegmentList(pCVar21);
          goto LAB_0010ab11;
        }
        if ((pvVar18->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
            super__Vector_impl_data._M_finish ==
            (pvVar18->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)._M_impl.
            super__Vector_impl_data._M_start) {
          __assert_fail("pWire->m_pRoutedSegmentList->size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/GRouter.cpp"
                        ,0x895,
                        "static int CGRouter::ConcurrentRouting(CDesign *, vector<CWire *> *, int)")
          ;
        }
        CWire::Pupate(pCVar21);
        CWire::Delete(pCVar21);
        (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar22] = (CWire *)0x0;
        CNet::Refine(pCVar4);
      }
      local_53c = local_53c + 1;
    }
LAB_0010ab11:
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

int CGRouter::ConcurrentRouting(CDesign* pDesign, vector<CWire*>* pWireList, int iMode)
{
	// make ILP solver ready [6/22/2006 thyeros]
	CILPSolver ILPSolver;
	
	ILPSolver.Delete();
	ILPSolver.Create((char*)pDesign->m_Param.m_cInput_File);

	char cName[MAX_BUFFER_STR];

	int	i,j,k,x,y,s,iD,iNumVariable;
	int	iNumWireRouted		=	0;

	//////////////////////////////////////////////////////////////////////////
	// filtering the already routed wires [7/7/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	for(i=0,s=pWireList->size();i<s;++i)
	{
		CWire*	pWire	=	(*pWireList)[i];
		if(pWire==NULL)	continue;
		
		if(FilterRouting(pDesign,pWire))
		{	
			// mark it is routed and DELETED [6/23/2006 thyeros]
			(*pWireList)[i]	=	NULL;
			
			++iNumWireRouted;			
		}
	}

	vector<vector<CSegment*>* >		InverseVariable;
	hash_map<ADDRESS, int>				Variable;
	set<CBoundary*>					Boundary;

	InverseVariable.reserve(pWireList->size()*2*pDesign->T());

	//thyeros: make the first empty as GLPK is doing [10/29/2005]
	InverseVariable.push_back((vector<CSegment*>*)NULL);
	
	//////////////////////////////////////////////////////////////////////////
	// variable constraints [6/24/2006 thyeros]
	// set objective function [6/24/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	for(i=0,s=pWireList->size();i<s;++i)
	{
		CWire*	pWire	=	(*pWireList)[i];
		if(pWire==NULL)	continue;

		assert(!pWire->IsRouted());

		CNet*	pNet	=	pWire->GetParent();
		// it is deleted from the net [7/1/2006 thyeros]
		if(pNet==NULL)
		{
			pWire->Delete();//SAFE_DEL(pWire);
			// mark it is routed and DELETED [6/23/2006 thyeros]
			(*pWireList)[i]	=	NULL;			
			++iNumWireRouted;

			continue;
		}
		
		assert(pNet);
		assert(!pNet->IsRouted());
		assert(!pWire->IsPoint());

		pWire->Enumerate(ENUM_MODE_L);
		
		int	iNumSegmentList	=	pWire->GetNumSegmentList();
		
		for(j=0;j<iNumSegmentList;++j)
		{		
			vector<CSegment*>*	pSegmentList	=	pWire->GetSegmentList(j);
			for (k=0;k<pSegmentList->size();k++)
			{
				CSegment*	pCurSegment	=	(*pSegmentList)[k];
				CBoundary*	pBoundary	=	NULL;
				CGrid*		pGrid		=	NULL;
				
				if(pCurSegment->IsHorizontal())
				{
					assert(pCurSegment->m_pPointS->Y()==pCurSegment->m_pPointE->Y());
					assert(pCurSegment->m_pPointS->Z()==pCurSegment->m_pPointE->Z());
					int iZ		=	pCurSegment->m_pPointS->Z();
					int	iY		=	pCurSegment->m_pPointS->Y();
					int	iMinX	=	pCurSegment->m_pPointS->X();
					int	iMaxX	=	pCurSegment->m_pPointE->X();
					
					assert(iMinX<=iMaxX);
					
					for (x=iMinX;x<iMaxX;x++)
					{
						pBoundary	=	pDesign->GetLayer(iZ)->GetBoundary(x,iY);					
						assert(pBoundary);
						
						if(pBoundary->IsFound(pNet))	continue;

						pBoundary->AddSegmentList(pSegmentList);
						//Boundary[pBoundary->GetKey()]	=	pBoundary;

						Boundary.insert(pBoundary);
					}
				}
				else if(pCurSegment->IsVertical())
				{
					assert(pCurSegment->m_pPointS->X()==pCurSegment->m_pPointE->X());
					assert(pCurSegment->m_pPointS->Z()==pCurSegment->m_pPointE->Z());
					int iZ		=	pCurSegment->m_pPointS->Z();
					int	iX		=	pCurSegment->m_pPointS->X();
					int	iMinY	=	pCurSegment->m_pPointS->Y();
					int	iMaxY	=	pCurSegment->m_pPointE->Y();
					
					assert(iMinY<=iMaxY);
					
					for (y=iMinY;y<iMaxY;y++)
					{
						pBoundary	=	pDesign->GetLayer(iZ)->GetBoundary(iX,y);						
						assert(pBoundary);
						
						if(pBoundary->IsFound(pNet))	continue;

						pBoundary->AddSegmentList(pSegmentList);
						Boundary.insert(pBoundary);
					}
				}
				else
				{
					assert(FALSE);
				}
			}// for each segment [6/22/2006 thyeros]
				
			if(iMode&PROP_PARAM_SOLVER_GLPK)
			{
#ifdef _DEBUG
				sprintf(cName,"v-seg%d.(%d,%d,%d)-(%d,%d,%d).%d",
					(int)pNet->GetKey(),
					pWire->m_pPointS->X(),pWire->m_pPointS->Y(),pWire->m_pPointS->Z(),
					pWire->m_pPointE->X(),pWire->m_pPointE->Y(),pWire->m_pPointE->Z(),j);
				for (k=0;k<pSegmentList->size();k++)
				{
					CSegment*	pCurSegment	=	(*pSegmentList)[k];
					sprintf(&cName[strlen(cName)],"=(%d,%d,%d)->(%d,%d,%d)",
						pCurSegment->m_pPointS->X(),pCurSegment->m_pPointS->Y(),pCurSegment->m_pPointS->Z(),
						pCurSegment->m_pPointE->X(),pCurSegment->m_pPointE->Y(),pCurSegment->m_pPointE->Z());
				}
#else
				cName[0]	=	NULL;		
#endif
			}
			else if(iMode&PROP_PARAM_SOLVER_MOSEK)
			{
				sprintf(cName,"X%d",ILPSolver.GetNumVariable()+1);
			}

			// each variable means a set of Segments which is a possible routing for this Wire [6/22/2006 thyeros]			
			// Variable[xxx] contains its index in problem matrix (column) [6/22/2006 thyeros]

			// layer assignment cost [9/22/2006 thyeros]
			if(iMode&PROP_PARAM_BOXR_ILPMAX)
			{
				double	dCost = 1+((pDesign->m_Param.GetProp()&PROP_PARAM_MULTILAYER)? 1.0/CWire::GetSegmentListCost(pSegmentList)/s:0);
				
				Variable[(ADDRESS)pSegmentList]	=	ILPSolver.AddVariable(cName,dCost,TRUE,0,TRUE,1);
			}
			else if(iMode&(PROP_PARAM_BOXR_ILPHYD|PROP_PARAM_BOXR_ILPMIN))
			{
				double	dCost =	0;
				
				Variable[(ADDRESS)pSegmentList]	=	ILPSolver.AddVariable(cName,dCost,TRUE,0,TRUE,1);
			}
			
			InverseVariable.push_back(pSegmentList);
			
		}// for each segment list [6/22/2006 thyeros]
				
		ILPSolver.PrepareCoeffBuffer(iNumSegmentList+1,Variable.size());
		

		if(iMode&PROP_PARAM_SOLVER_GLPK)
		{
#ifdef _DEBUG
			sprintf(cName,"v-wire%d.(%d,%d)-(%d,%d)",(int)pNet->GetKey(),pWire->m_pPointS->X(),pWire->m_pPointS->Y(),pWire->m_pPointE->X(),pWire->m_pPointE->Y());
#else
			cName[0]	=	NULL;		
#endif
		}
		else if(iMode&PROP_PARAM_SOLVER_MOSEK)
		{
			sprintf(cName,"Z%d",ILPSolver.GetNumConstraint()+1);
		}

		// add constraint such that one of segment lists for each wire should be selected [6/22/2006 thyeros]
		if(iMode&PROP_PARAM_BOXR_ILPMAX)								ILPSolver.AddConstraint(cName,iNumSegmentList,TRUE,0,TRUE,1);
		else if(iMode&(PROP_PARAM_BOXR_ILPHYD|PROP_PARAM_BOXR_ILPMIN))	ILPSolver.AddConstraint(cName,iNumSegmentList,TRUE,1,TRUE,1);	
	}// for each wire [6/22/2006 thyeros]
	
	InverseVariable.resize(InverseVariable.size());
	assert(Variable.size()==InverseVariable.size()-1);
	iNumVariable	=	Variable.size();

	//////////////////////////////////////////////////////////////////////////
	// depending on the obj, needs max utilization variable [6/28/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	if(iMode&PROP_PARAM_BOXR_ILPMAX)
	{
		iD	=	-1;
	}
	else if(iMode&(PROP_PARAM_BOXR_ILPHYD|PROP_PARAM_BOXR_ILPMIN))
	{
		iD	=	ILPSolver.AddVariable("v-D",1,TRUE,0,FALSE,MAX_NUMBER);

		if(iMode&PROP_PARAM_BOXR_ILPHYD)
		{
			ILPSolver.SetCoeffIndex(1,iD);
			ILPSolver.AddConstraint("c-D",1,TRUE,0,TRUE,pDesign->GetCapacity(GET_MODE_MAX)+1);
		}
	}
	
	//////////////////////////////////////////////////////////////////////////
	// congestion constraint for each boundary [6/22/2006 thyeros]
	//////////////////////////////////////////////////////////////////////////
	for(set<CBoundary*>::iterator itr=Boundary.begin(),end=Boundary.end();itr!=end;++itr)
	{
		CBoundary*	pBoundary	=	*itr;//->second;
		int	iNumSegmentList		=	pBoundary->GetNumSegmentList();
		
		ILPSolver.PrepareCoeffBuffer(iNumSegmentList+2);
		
		for (i=0;i<iNumSegmentList;++i)
		{
			vector<CSegment*>*	pSegmentList	=	pBoundary->GetSegmentList(i);
			
			assert(Variable.find((ADDRESS)pSegmentList)!=Variable.end());			
			ILPSolver.SetCoeffIndex(i+1,Variable.find((ADDRESS)pSegmentList)->second);

			// each segment needs its own required width and spacing [2/3/2007 thyeros]
			ILPSolver.SetCoeff(i+1,2);//pBoundary->GetParent()->GetDesignRule(GET_DR_MIN_WIR_SPACING)+pSegmentList->at(0)->GetWidth());
		}

		if(iMode&PROP_PARAM_SOLVER_GLPK)
		{
#ifdef _DEBUG
			sprintf(cName,"v-bnd(%d,%d,%d)_of_%d",pBoundary->X(),pBoundary->Y(),pBoundary->Z(),pBoundary->GetCapacity(GET_MODE_ACAP));
#else
			cName[0]	=	NULL;		
#endif
		}
		else if(iMode&PROP_PARAM_SOLVER_MOSEK)
		{
			sprintf(cName,"Y%d",ILPSolver.GetNumConstraint());
		}

		if(iMode&PROP_PARAM_BOXR_ILPMAX)
		{
			assert(iD==-1);
			ILPSolver.AddConstraint(cName,iNumSegmentList,TRUE,0,TRUE,pBoundary->GetCapacity(GET_MODE_ACAP));
		}
		else if(iMode&(PROP_PARAM_BOXR_ILPHYD|PROP_PARAM_BOXR_ILPMIN))
		{
			assert(iD>0);
			ILPSolver.SetCoeffIndex(i+1,iD);

			ILPSolver.SetCoeff(i+1,-1.0*pBoundary->GetParent()->GetCapacity(GET_MODE_MAX)/pDesign->GetCapacity(GET_MODE_MAX));	
			ILPSolver.AddConstraint(cName,iNumSegmentList+1,FALSE,0,TRUE,-pBoundary->GetCapacity(GET_MODE_OCAP));

			// make it back to one for other variables [6/26/2006 thyeros]
			ILPSolver.SetCoeff(i+1,1);
		}
		
		pBoundary->ClearSegmentList();	
		assert(pBoundary->GetNumSegmentList()==0);
	}
	
	CObject::PrintMsg2("..#v=%d #c=%d ",ILPSolver.GetNumVariable(),ILPSolver.GetNumConstraint());
	
	int	iSolMode	=	0;
	if(iMode&PROP_PARAM_SOLVER_GLPK)
	{
		if(iMode&PROP_PARAM_BOXR_ILPMAX)
		{
			if(iMode&PROP_PARAM_BOXR_ILP_RNDUP)		iSolMode	=	SOL_OPTION_MAX|SOL_OPTION_SIMPLEX;
			else									iSolMode	=	SOL_OPTION_MAX|SOL_OPTION_MIP;
		}
		else if(iMode&PROP_PARAM_BOXR_ILPMIN)
		{
			if(iMode&PROP_PARAM_BOXR_ILP_RNDUP)		iSolMode	=	SOL_OPTION_MIN|SOL_OPTION_SIMPLEX;
			else									iSolMode	=	SOL_OPTION_MIN|SOL_OPTION_MIP;
		}
		else if(iMode&PROP_PARAM_BOXR_ILPHYD)
		{
			//////////////////////////////////////////////////////////////////////////
			// heuristically decide the better approach [6/29/2006 thyeros]
			// check # of constratins [6/29/2006 thyeros]
			//////////////////////////////////////////////////////////////////////////
			if(iMode&PROP_PARAM_BOXR_ILP_RNDUP)		iSolMode	=	ILPSolver.GetNumConstraint()>MAX_ILP_CONSTRAINT? 0:SOL_OPTION_MIN|SOL_OPTION_SIMPLEX;
			else									iSolMode	=	ILPSolver.GetNumConstraint()>MAX_ILP_CONSTRAINT? 0:SOL_OPTION_MIN|SOL_OPTION_MIP;
		}

		if(iSolMode)
		{
			//////////////////////////////////////////////////////////////////////////
			// solve the problem [6/24/2006 thyeros]
			//////////////////////////////////////////////////////////////////////////
			double	dObjectValue	=	0;
			ILPSolver.PrepareSolutionBuffer(InverseVariable.size());			

#ifdef _DEBUG
			//sprintf(cName,"%s_p%d.txt",pDesign->m_Param.m_cInput_File,pDesign->m_iLoop-1);
			//ILPSolver.Print(cName,SOL_PRINT_PRO);
#endif
	
			if(ILPSolver.Solve(iSolMode,&dObjectValue))
			{
#ifdef _DEBUG
				//sprintf(cName,"%s_s%d.txt",pDesign->GetName(),pDesign->m_iLoop-1);
				//ILPSolver.Print(cName,SOL_PRINT_SOL);
#endif
				CObject::PrintMsg2("*o=%.2f\t",dObjectValue);

				if(iMode&PROP_PARAM_BOXR_ILP_RNDUP)		ILPSolver.RoundUp(0.5);

				if(iMode&PROP_PARAM_BOXR_ILPHYD&&(int)dObjectValue>pDesign->GetCapacity(GET_MODE_MAX))
				{
					CObject::PrintMsg2("=give up solution\n");
				}
				else
				{
					//////////////////////////////////////////////////////////////////////////
					// retrieve the solution [6/24/2006 thyeros]
					//////////////////////////////////////////////////////////////////////////	
					for (i=1;i<=iNumVariable;++i)
					{
						if(ILPSolver.GetSolution(i))
						{	
							CSegment*	pSegment	=	(*InverseVariable[i])[0];

//							assert(pSegment->GetParent()->m_pRoutedSegmentList==NULL);
							pSegment->GetParent()->m_pRoutedSegmentList	=	InverseVariable[i];	
							assert(pSegment->GetParent()->m_pRoutedSegmentList->size());
						}
					}		
				}
#ifdef _DEBUG
				if(iD>0)
				{
					if((int)ILPSolver.GetSolution(iD)!=(int)dObjectValue)
					{
						printf("ERROR: ILP objective iD=%d(%f) vs dObjectValue=%d(%f)\n",
							(int)ILPSolver.GetSolution(iD),ILPSolver.GetSolution(iD),
							(int)dObjectValue,dObjectValue);
					}
					assert((int)ILPSolver.GetSolution(iD)==(int)dObjectValue);
				}
#endif
			}
		}
		else
		{
			CObject::PrintMsg2("\t= discarded (maxc %d)\n",MAX_ILP_CONSTRAINT);
		}
	}
	else if(iMode&PROP_PARAM_SOLVER_MOSEK)
	{
		sprintf(cName,"%s_l%d.mps",pDesign->m_Param.m_cInput_File,pDesign->m_iLoop-1);
		//sprintf(cName,"br.mps");
		ILPSolver.Write(cName,SOL_FORMAT_FREEMPS);

		// run mosek [10/13/2006 thyeros]
		char cLine[MAX_BUFFER_STR];

		sprintf(cLine,"mosek -max %s -d MSK_IPAR_READ_MPS_FORMAT 2 -d MSK_IPAR_WRITE_SOL_CONSTRAINTS 0 -d MSK_IPAR_WRITE_BAS_CONSTRAINTS 0 -d MSK_IPAR_WRITE_BAS_HEAD 0 -d MSK_IPAR_WRITE_BAS_VARIABLES 0 -d MSK_IPAR_LOG 0",cName);

		CreateAndWait(cLine);

		sprintf(cName,"%s_l%d.sol",pDesign->m_Param.m_cInput_File,pDesign->m_iLoop-1);
		for(FILE* pFile=fopen(cName,"rt");fgets(cLine,sizeof(cLine),pFile);)
		{
			char*	pToken	=	strtok(cLine," \t\n");
			pToken	=	strtok(NULL," \t\n");

			if(pToken==NULL)	continue;

			switch(pToken[0]){
				case 'X':
					{
						int		iIndex			=	atoi(pToken+1);
						strtok(NULL," \t\n");
						if(atof(strtok(NULL," \t\n"))>=0.5)
						{
							CSegment*	pSegment	=	(*InverseVariable[iIndex])[0];

							assert(pSegment->GetParent()->m_pRoutedSegmentList==NULL);
							pSegment->GetParent()->m_pRoutedSegmentList	=	InverseVariable[iIndex];	
							assert(pSegment->GetParent()->m_pRoutedSegmentList->size());
						}
					}
					break;
				default:
					break;
			}	
		}
	}

	for(i=0,s=pWireList->size();i<s;++i)
	{
		CWire*	pWire	=	(*pWireList)[i];
		if(pWire==NULL)	continue;

		CNet*	pNet	=	pWire->GetParent();

		if(pNet==NULL)
		{
			pWire->Delete();//SAFE_DEL(pWire);

			// mark it is routed and DELETED [6/23/2006 thyeros]
			(*pWireList)[i]	=	NULL;
			
			++iNumWireRouted;

			// must be discarded [7/1/2006 thyeros]
			continue;
		}

		if(pWire->m_pRoutedSegmentList)
		{
			assert(pWire->m_pRoutedSegmentList->size());

/*			if(pNet->GetKey()==11)
			{
				pNet->Print(stdout,PRINT_MODE_TEXT);
				pWire->Print(stdout,PRINT_MODE_TEXT);

				printf("==============\n");				

				vector<CSegment*>* pSegmentList	=	pWire->m_pRoutedSegmentList;
				for(int k=0;k<pSegmentList->size();k++)
				{
					pSegmentList->at(k)->Print(stdout,PRINT_MODE_TEXT);	
				}
			}
*/

			pWire->Pupate();
			pWire->Delete();//SAFE_DEL(pWire);

			// mark it is routed and DELETED [6/23/2006 thyeros]
			(*pWireList)[i]	=	NULL;
	
			++iNumWireRouted;

			pNet->Refine();
		}
		else
		{
			pWire->ClearSegmentList();
		}

#ifdef _DEBUG
		if(pNet->GetKey()==pDesign->m_iDebugNet)
		{
			pDesign->PrintFile("debug.m",PRINT_MODE_MATLAB);
			pNet->PrintFile(">debug.m",PRINT_MODE_MATLAB);
		}
#endif
	}
	
	return	iNumWireRouted;
}